

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O1

void __thiscall Js::ConfigFlagsTable::FlagSetCallback_ES6All(ConfigFlagsTable *this,Boolean value)

{
  ulong in_RAX;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong extraout_RDX;
  int iVar4;
  bool bVar5;
  
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    if (0x24 < uVar2 - 0x75) {
      uVar3 = in_RAX;
    }
    in_RAX = uVar3 & 0xffffffff;
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x76);
  uVar2 = in_RAX;
  do {
    iVar4 = (int)(uVar2 & 0xffff);
    if (iVar4 != 0x97) {
      if (iVar4 == 0x1d7) {
        return;
      }
      Output::VerboseNote(L"FLAG %s = %d - setting child flag %s = %d\n",L"ES6",(ulong)value,
                          (&FlagNames)[uVar2 & 0xffff],(ulong)value);
      SetAsBoolean(this,(Flag)uVar2,value);
      in_RAX = extraout_RDX;
    }
    uVar1 = iVar4 + 1;
    if ((ushort)((Flag)uVar2 - InvalidFlag) < 2) {
      uVar1 = 0;
    }
    uVar2 = 0x1d7;
    if (uVar1 < 0x1d6) {
      uVar3 = (ulong)uVar1;
      do {
        bVar5 = 0x24 < uVar3 - 0x75;
        uVar2 = uVar3;
        if (bVar5) {
          uVar2 = in_RAX;
        }
        in_RAX = uVar2 & 0xffffffff;
        uVar2 = in_RAX;
      } while ((bVar5) && (uVar3 = uVar3 + 1, uVar2 = 0x1d7, uVar3 != 0x1d6));
    }
  } while( true );
}

Assistant:

void
    ConfigFlagsTable::FlagSetCallback_ES6All(Boolean value)
    {
        // iterate through all ES6 flags - and set them explicitly (except ES6Verbose)
        Flag parentFlag = ES6Flag;

        // parent ES6 flag, will iterate through all child ES6 flags
        Flag childFlag = GetNextChildFlag(parentFlag, /* no currentChildFlag */ InvalidFlag);
        while (childFlag != InvalidFlag)
        {
            // skip verbose
            if (childFlag != ES6VerboseFlag)
            {
                Boolean childValue = value;

                Output::VerboseNote(_u("FLAG %s = %d - setting child flag %s = %d\n"), FlagNames[(int) parentFlag], value, FlagNames[(int) childFlag], childValue);
                this->SetAsBoolean(childFlag, childValue);
            }

            // get next child flag
            childFlag = GetNextChildFlag(parentFlag, /* currentChildFlag */ childFlag);
        }
    }